

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O0

Vec_Wec_t * Gia_Iso4Gia(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  uint local_3c [2];
  int RandC [2];
  int i;
  Gia_Obj_t *pObj;
  int l;
  Vec_Int_t *vLevel;
  Vec_Wec_t *vLevs;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManLevelizeR(p);
  Abc_Random(1);
  pObj._4_4_ = 0;
  do {
    iVar2 = Vec_WecSize(p_00);
    if (iVar2 <= pObj._4_4_) {
      return p_00;
    }
    p_01 = Vec_WecEntry(p_00,pObj._4_4_);
    local_3c[0] = Abc_Random(0);
    local_3c[1] = Abc_Random(0);
    if (pObj._4_4_ == 0) {
      RandC[0] = 0;
      while( true ) {
        iVar2 = RandC[0];
        iVar3 = Vec_IntSize(p_01);
        bVar6 = false;
        if (iVar2 < iVar3) {
          iVar2 = Vec_IntEntry(p_01,RandC[0]);
          register0x00000000 = Gia_ManObj(p,iVar2);
          bVar6 = register0x00000000 != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar2 = Gia_ObjIsCo(stack0xffffffffffffffd0);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso3.c"
                        ,0xb9,"Vec_Wec_t *Gia_Iso4Gia(Gia_Man_t *)");
        }
        uVar4 = Abc_Random(0);
        stack0xffffffffffffffd0->Value = uVar4;
        uVar4 = stack0xffffffffffffffd0->Value;
        iVar2 = Gia_ObjFaninC0(stack0xffffffffffffffd0);
        uVar1 = local_3c[iVar2];
        pGVar5 = Gia_ObjFanin0(stack0xffffffffffffffd0);
        pGVar5->Value = uVar4 + uVar1 + pGVar5->Value;
        RandC[0] = RandC[0] + 1;
      }
    }
    else {
      RandC[0] = 0;
      while( true ) {
        iVar2 = RandC[0];
        iVar3 = Vec_IntSize(p_01);
        bVar6 = false;
        if (iVar2 < iVar3) {
          iVar2 = Vec_IntEntry(p_01,RandC[0]);
          register0x00000000 = Gia_ManObj(p,iVar2);
          bVar6 = register0x00000000 != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar2 = Gia_ObjIsAnd(stack0xffffffffffffffd0);
        if (iVar2 != 0) {
          uVar4 = stack0xffffffffffffffd0->Value;
          iVar2 = Gia_ObjFaninC0(stack0xffffffffffffffd0);
          uVar1 = local_3c[iVar2];
          pGVar5 = Gia_ObjFanin0(stack0xffffffffffffffd0);
          pGVar5->Value = uVar4 + uVar1 + pGVar5->Value;
          uVar4 = stack0xffffffffffffffd0->Value;
          iVar2 = Gia_ObjFaninC1(stack0xffffffffffffffd0);
          uVar1 = local_3c[iVar2];
          pGVar5 = Gia_ObjFanin1(stack0xffffffffffffffd0);
          pGVar5->Value = uVar4 + uVar1 + pGVar5->Value;
        }
        RandC[0] = RandC[0] + 1;
      }
    }
    pObj._4_4_ = pObj._4_4_ + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_Iso4Gia( Gia_Man_t * p )
{
    Vec_Wec_t * vLevs = Gia_ManLevelizeR( p );
    Vec_Int_t * vLevel; int l;
    Abc_Random( 1 );
    Vec_WecForEachLevel( vLevs, vLevel, l )
    {
        Gia_Obj_t * pObj;  int i;
        int RandC[2] = { Abc_Random(0), Abc_Random(0) };
        if ( l == 0 )
        {
            Gia_ManForEachObjVec( vLevel, p, pObj, i )
            {
                assert( Gia_ObjIsCo(pObj) );
                pObj->Value = Abc_Random(0);
                Gia_ObjFanin0(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC0(pObj)];
            }
        }
        else 
        {
            Gia_ManForEachObjVec( vLevel, p, pObj, i ) if ( Gia_ObjIsAnd(pObj) )
            {
                Gia_ObjFanin0(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC0(pObj)];
                Gia_ObjFanin1(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC1(pObj)];
            }
        }
    }
    return vLevs;
}